

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edata_cache.c
# Opt level: O3

_Bool duckdb_je_edata_cache_init(edata_cache_t *edata_cache,base_t *base)

{
  _Bool _Var1;
  
  duckdb_je_edata_avail_new(&edata_cache->avail);
  (edata_cache->count).repr = 0;
  _Var1 = duckdb_je_malloc_mutex_init
                    (&edata_cache->mtx,"edata_cache",WITNESS_RANK_EDATA_CACHE,
                     malloc_mutex_rank_exclusive);
  if (!_Var1) {
    edata_cache->base = base;
  }
  return _Var1;
}

Assistant:

bool
edata_cache_init(edata_cache_t *edata_cache, base_t *base) {
	edata_avail_new(&edata_cache->avail);
	/*
	 * This is not strictly necessary, since the edata_cache_t is only
	 * created inside an arena, which is zeroed on creation.  But this is
	 * handy as a safety measure.
	 */
	atomic_store_zu(&edata_cache->count, 0, ATOMIC_RELAXED);
	if (malloc_mutex_init(&edata_cache->mtx, "edata_cache",
	    WITNESS_RANK_EDATA_CACHE, malloc_mutex_rank_exclusive)) {
		return true;
	}
	edata_cache->base = base;
	return false;
}